

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int ixxx::posix::waitid(idtype_t __idtype,__id_t __id,siginfo_t *__infop,int __options)

{
  int iVar1;
  waitid_error *this;
  int *piVar2;
  
  iVar1 = ::waitid(__idtype,__id,__infop,__options);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (waitid_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  waitid_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&waitid_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void waitid(idtype_t idtype, id_t id, siginfo_t *infop, int options)
    {
      int r = ::waitid(idtype, id, infop, options);
      if (r == -1)
        throw waitid_error(errno);
    }